

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

int main(int argc,char **argv)

{
  int sizx;
  int iVar1;
  qnode_ptr_t ptVar2;
  qnode_ptr_t p;
  long lVar3;
  int iVar4;
  kernel_t *pkVar5;
  undefined8 *puVar6;
  int num;
  byte bVar7;
  undefined8 auStackY_cc8 [159];
  undefined8 local_7d0 [138];
  undefined8 uStackY_380;
  int iter;
  int y;
  int x;
  int histo;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int vmag;
  int col;
  int row;
  int horn;
  int nbin;
  int sf;
  float maxv;
  float density;
  float std;
  float avg_err;
  float delta;
  float alpha;
  float incr;
  float trsh;
  float sigma1;
  qnode_ptr_t flh;
  qnode_ptr_t cub2h;
  qnode_ptr_t cub1h;
  ulong local_268;
  qnode_ptr_t local_260;
  qnode_ptr_t local_258;
  qnode_ptr_t local_250;
  int binary;
  int mid_num;
  float sigma2;
  string c_fname;
  string i_fname;
  uchar hd [32];
  string h_fname;
  string v_fname;
  string out_path;
  string in_path;
  
  bVar7 = 0;
  uStackY_380 = 0x104df7;
  valid_option(argc,argv,in_path,out_path,&sigma1,&sigma2,&histo,&sf,&trsh,i_fname,v_fname,c_fname,
               h_fname,&nbin,&incr,&mid_num,&alpha,&delta,&iter,&binary,&row,&col,&horn,&vmag,&maxv)
  ;
  puts("STAGE 1: Options Validated");
  fflush(_stdout);
  generate_gauss(&ker1,SUB84((double)sigma1,0));
  generate_gauss(&ker2,SUB84((double)sigma2,0));
  iVar1 = frames(ker2.m);
  num = (ker2.m + 4) / -2 + mid_num;
  local_268 = (ulong)(uint)binary;
  if (binary == 0) {
    raster_size(i_fname,num,&x,&y);
  }
  else {
    binary_size(row,col,&x,&y);
  }
  cub1h = (qnode_ptr_t)0x0;
  cub2h = (qnode_ptr_t)0x0;
  flh = (qnode_ptr_t)0x0;
  local_2c4 = x;
  local_2c8 = y;
  ptVar2 = create_node(0,0x13c,x,y,iVar1,0);
  iVar4 = iVar1 + 1;
  local_2c0 = iVar4;
  p = create_node(0,0x13c,x,y,iVar4 - ker2.m,0);
  insert_node(ptVar2,&cub1h,&local_250);
  insert_node(p,&cub2h,&local_258);
  init_cube(ptVar2,iVar1);
  init_cube(p,iVar4 - ker2.m);
  puts("STAGE 2: Initializations Completed");
  fflush(_stdout);
  sizx = local_2c4;
  iVar4 = local_2c8;
  load_frames(i_fname,hd,num,iVar1,local_2c4,local_2c8,ptVar2,(int)local_268);
  puts("STAGE 3: Input Data Read");
  fflush(_stdout);
  pkVar5 = &ker1;
  puVar6 = auStackY_cc8;
  for (lVar3 = 0x9f; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *(undefined8 *)pkVar5->k;
    pkVar5 = (kernel_t *)((long)pkVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  pkVar5 = &ker2;
  puVar6 = local_7d0;
  for (lVar3 = 0x9f; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *(undefined8 *)pkVar5->k;
    pkVar5 = (kernel_t *)((long)pkVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  convolve(ptVar2,p,iVar1);
  puts("STAGE 4: Convolutions Completed");
  fflush(_stdout);
  free_cube(ptVar2,iVar1);
  delete_node(ptVar2,&cub1h,&local_250);
  iVar1 = local_2c0;
  ptVar2 = create_node(0,0x13c,sizx,iVar4,local_2c0 - ker2.m,p->ofst);
  insert_node(ptVar2,&flh,&local_260);
  init_flow(ptVar2,iVar1 - ker2.m);
  C.k[0] = -1.0;
  C.k[1] = 8.0;
  C.k[2] = 0.0;
  C.k[3] = -8.0;
  C.k[4] = 1.0;
  C.f = 12.0;
  C.m = 5;
  compute_deriv(p,ptVar2,horn);
  puts("STAGE 5: Derivatives Computed");
  fflush(_stdout);
  KERNEL_Y = (int)(sigma1 * 3.0 + 1.0);
  KERNEL_X = KERNEL_Y;
  if (horn == 0) {
    nagel_relax(ptVar2,SUB84((double)alpha,0),SUB84((double)delta,0),iter,c_fname,histo);
  }
  else {
    horn_relax(ptVar2,SUB84((double)alpha,0),iter,c_fname,histo);
  }
  puts("STAGE 6: Regularization Completed");
  fflush(_stdout);
  if (sf != 0) {
    filter(ptVar2,ptVar2,SUB84((double)trsh,0));
    puts("STAGE 7: Filtering Out Completed");
    fflush(_stdout);
  }
  if (histo != 0) {
    prod_histo(ptVar2,c_fname,h_fname,nbin,SUB84((double)incr,0),&avg_err,&std,&density);
    puts("STAGE 8: Histograms Produced");
    fflush(_stdout);
  }
  if (vmag != 0) {
    screen(ptVar2,SUB84((double)maxv,0));
  }
  write_velocity(v_fname,ptVar2);
  puts("STAGE 9: Flow Written to File");
  fflush(_stdout);
  free_cube(p,iVar1 - ker2.m);
  free_flow(ptVar2,iVar1 - ker2.m);
  delete_node(p,&cub2h,&local_258);
  delete_node(ptVar2,&flh,&local_260);
  puts("STAGE 10: End of Program\n");
  if (histo != 0) {
    printf("         Average Angular Error: %10.5f\n",SUB84((double)avg_err,0));
    printf("            Standard Deviation: %10.5f\n",SUB84((double)std,0));
    printf("                       Density: %10.5f\n",SUB84((double)density * 100.0,0));
    fflush(_stdout);
  }
  return 0;
}

Assistant:

int main(argc,argv)
int argc ;
char *argv[] ;

{ qnode_ptr_t create_node(), cub1h, cub1q, cub2h, cub2q, flh, flq,
              cub1, cub2, fl ;
  unsigned char hd[H] ;
  float sigma1, sigma2, trsh, incr, alpha, delta, avg_err, std, density,
        maxv ;
  int histo, sf, start_num, mid_num, x, y, z, nbin, iter, binary, horn,
      row, col, vmag ;
  string in_path,out_path,i_fname, v_fname, c_fname, h_fname ;

  valid_option(argc,argv,in_path,out_path,&sigma1,&sigma2,&histo,&sf,&trsh,
  i_fname,v_fname,c_fname,h_fname,&nbin,&incr,&mid_num,&alpha,&delta,&iter,
  &binary,&row,&col,&horn,&vmag,&maxv) ;
  printf("STAGE 1: Options Validated\n") ; fflush(stdout) ;
  generate_gauss(&ker1,sigma1) ;
  generate_gauss(&ker2,sigma2) ;
  z = frames(ker2.m) ;
  start_num = start_number(mid_num,ker2.m) ;
  if (!binary) {
    raster_size(i_fname,start_num,&x,&y) ;
  }
  else {
    binary_size(row,col,&x,&y) ;
  }
  init_list(&cub1h,&cub1q) ;
  init_list(&cub2h,&cub2q) ;
  init_list(&flh,&flq) ;
  cub1 = create_node(0,X,x,y,z,0) ;
  cub2 = create_node(0,X,x,y,z - ker2.m + 1,0) ;
  insert_node(cub1,&cub1h,&cub1q) ;
  insert_node(cub2,&cub2h,&cub2q) ;
  init_cube(cub1,z) ;
  init_cube(cub2,z - ker2.m + 1) ;
  printf("STAGE 2: Initializations Completed\n") ; fflush(stdout) ;
  load_frames(i_fname,hd,start_num,z,x,y,cub1,binary) ;
  printf("STAGE 3: Input Data Read\n") ; fflush(stdout) ;
  convolve(cub1,cub2,ker1,ker2,z) ;
  printf("STAGE 4: Convolutions Completed\n") ; fflush(stdout) ;
  free_cube(cub1,z) ;
  delete_node(cub1,&cub1h,&cub1q) ;
  fl = create_node(0,X,x,y,z - ker2.m + 1,cub2->ofst) ;
  insert_node(fl,&flh,&flq) ;
  init_flow(fl,z - ker2.m + 1) ;
  init_central(&C) ;
  compute_deriv(cub2,fl,horn) ;
  printf("STAGE 5: Derivatives Computed\n") ; fflush(stdout) ;
  KERNEL_X = (int)(3.0*sigma1 + 1.0) ;
  KERNEL_Y = (int)(3.0*sigma1 + 1.0) ;
  if (horn) {
    horn_relax(fl,alpha,iter,c_fname,histo) ;
  }
  else {
    nagel_relax(fl,alpha,delta,iter,c_fname,histo) ;
  }
  printf("STAGE 6: Regularization Completed\n") ; fflush(stdout) ;
  if (sf) {
    filter(fl,fl,trsh) ;
    printf("STAGE 7: Filtering Out Completed\n") ; fflush(stdout) ;
  }
  if (histo) {
    prod_histo(fl,c_fname,h_fname,nbin,incr,&avg_err,&std,&density) ;
    printf("STAGE 8: Histograms Produced\n") ; fflush(stdout) ;
  }
  if (vmag) {
    screen(fl,maxv) ;
  }
  write_velocity(v_fname,fl) ;
  printf("STAGE 9: Flow Written to File\n") ; fflush(stdout) ;
  free_cube(cub2,z - ker2.m + 1) ;
  free_flow(fl,z - ker2.m + 1) ;
  delete_node(cub2,&cub2h,&cub2q) ;
  delete_node(fl,&flh,&flq) ;
  printf("STAGE 10: End of Program\n\n") ;
  if (histo) {
    printf("         Average Angular Error: %10.5f\n", avg_err) ;
    printf("            Standard Deviation: %10.5f\n", std) ;
    printf("                       Density: %10.5f\n", density*100.0) ;
    fflush(stdout) ;
  }
}